

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::insertCompletions
          (QPDFArgParser *this,option_table_t *option_table,string *choice_option,
          string *extra_prefix)

{
  ulong uVar1;
  element_type *peVar2;
  char *pcVar3;
  string *extra_prefix_local;
  string *choice_option_local;
  option_table_t *option_table_local;
  QPDFArgParser *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    addChoicesToCompletions(this,option_table,choice_option,extra_prefix);
  }
  else {
    std::__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      peVar2 = std::
               __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pcVar3 = (char *)std::__cxx11::string::at((ulong)&peVar2->bash_cur);
      if (*pcVar3 == '-') {
        addOptionsToCompletions(this,option_table);
      }
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::insertCompletions(
    option_table_t& option_table, std::string const& choice_option, std::string const& extra_prefix)
{
    if (!choice_option.empty()) {
        addChoicesToCompletions(option_table, choice_option, extra_prefix);
    } else if ((!m->bash_cur.empty()) && (m->bash_cur.at(0) == '-')) {
        addOptionsToCompletions(option_table);
    }
}